

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O3

uint16_t basisu::etc_block::pack_delta3(int r,int g,int b)

{
  if (7 < r + 4U) {
    __assert_fail("(r >= cETC1ColorDeltaMin) && (r <= cETC1ColorDeltaMax)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_etc.cpp"
                  ,0x1ca,"static uint16_t basisu::etc_block::pack_delta3(int, int, int)");
  }
  if (g + 4U < 8) {
    if (b + 4U < 8) {
      return ((short)r + (short)(r >> 0x1f) * -8) * 0x40 | ((short)g + (short)(g >> 0x1f) * -8) * 8
             | (short)b + (short)(b >> 0x1f) * -8;
    }
    __assert_fail("(b >= cETC1ColorDeltaMin) && (b <= cETC1ColorDeltaMax)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_etc.cpp"
                  ,0x1cc,"static uint16_t basisu::etc_block::pack_delta3(int, int, int)");
  }
  __assert_fail("(g >= cETC1ColorDeltaMin) && (g <= cETC1ColorDeltaMax)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_etc.cpp"
                ,0x1cb,"static uint16_t basisu::etc_block::pack_delta3(int, int, int)");
}

Assistant:

uint16_t etc_block::pack_delta3(int r, int g, int b)
	{
		assert((r >= cETC1ColorDeltaMin) && (r <= cETC1ColorDeltaMax));
		assert((g >= cETC1ColorDeltaMin) && (g <= cETC1ColorDeltaMax));
		assert((b >= cETC1ColorDeltaMin) && (b <= cETC1ColorDeltaMax));
		if (r < 0) r += 8;
		if (g < 0) g += 8;
		if (b < 0) b += 8;
		return static_cast<uint16_t>(b | (g << 3) | (r << 6));
	}